

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O1

int gotcha_strcmp(char *in_one,char *in_two)

{
  char cVar1;
  long lVar2;
  
  cVar1 = *in_one;
  lVar2 = 0;
  while( true ) {
    if (cVar1 == '\0') {
      return (int)(in_two[lVar2] != '\0');
    }
    if (cVar1 != in_two[lVar2]) break;
    cVar1 = in_one[lVar2 + 1];
    lVar2 = lVar2 + 1;
  }
  return (int)cVar1 - (int)in_two[lVar2];
}

Assistant:

int gotcha_strcmp(const char *in_one, const char *in_two)
{
  int i = 0;
  for (;; i++) {
    if (in_one[i] == '\0') {
      return (in_two[i] == '\0') ? 0 : 1;
    }
    if (in_one[i] != in_two[i]) {
      return in_one[i] - in_two[i];
    }
  }
}